

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O2

void __thiscall jsonnet::internal::Unparser::unparse(Unparser *this,AST *ast_,bool space_before)

{
  char32_t cVar1;
  undefined8 *puVar2;
  pointer pFVar3;
  AST *pAVar4;
  long lVar5;
  ostream *poVar6;
  BinaryOp bop;
  bool bVar7;
  Element *element;
  pointer pFVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char32_t *pcVar11;
  Field *field;
  pointer *ppFVar12;
  Fodder *pFVar13;
  bool bVar14;
  undefined1 auVar15 [12];
  string local_60;
  Fodder *local_40;
  long local_38;
  
  do {
    pAVar4 = left_recursive(ast_);
    bVar7 = (bool)(space_before & 1);
    fill(this,&ast_->openFodder,bVar7,pAVar4 == (AST *)0x0);
    if (ast_ == (AST *)0x0) {
LAB_001e79a6:
      poVar6 = std::operator<<((ostream *)&std::cerr,"INTERNAL ERROR: Unknown AST: ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,ast_);
      std::endl<char,std::char_traits<char>>(poVar6);
      abort();
    }
    lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Apply::typeinfo);
    if (lVar5 != 0) {
      unparse(this,*(AST **)(lVar5 + 0x80),bVar7);
      fill(this,(Fodder *)(lVar5 + 0x88),false,false);
      std::operator<<(this->o,"(");
      pFVar13 = *(Fodder **)(lVar5 + 0xa8);
      bVar7 = true;
      for (ppFVar12 = (pointer *)(*(long *)(lVar5 + 0xa0) + 0x40);
          (Fodder *)(ppFVar12 + -8) != pFVar13; ppFVar12 = ppFVar12 + 0xb) {
        if (!bVar7) {
          std::operator<<(this->o,',');
        }
        bVar7 = (bool)(bVar7 ^ 1);
        if (ppFVar12[-5] != (pointer)0x0) {
          fill(this,(Fodder *)(ppFVar12 + -8),bVar7,true);
          poVar6 = this->o;
          encode_utf8(&local_60,(UString *)ppFVar12[-5]);
          std::operator<<(poVar6,(string *)&local_60);
          std::__cxx11::string::~string((string *)&local_60);
          std::operator<<(this->o,"=");
          bVar7 = false;
        }
        unparse(this,(AST *)ppFVar12[-1],bVar7);
        bVar7 = false;
        fill(this,(Fodder *)ppFVar12,false,false);
      }
      if (*(char *)(lVar5 + 0xb8) != '\0') {
        std::operator<<(this->o,",");
      }
      fill(this,(Fodder *)(lVar5 + 0xc0),false,false);
      std::operator<<(this->o,")");
      if (*(char *)(lVar5 + 0xf0) != '\x01') {
        return;
      }
      fill(this,(Fodder *)(lVar5 + 0xd8),true,true);
      poVar6 = this->o;
      pcVar9 = "tailstrict";
      goto LAB_001e6b0e;
    }
    lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ApplyBrace::typeinfo);
    if (lVar5 == 0) {
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Array::typeinfo);
      if (lVar5 != 0) {
        std::operator<<(this->o,"[");
        puVar2 = *(undefined8 **)(lVar5 + 0x88);
        bVar7 = true;
        for (puVar10 = *(undefined8 **)(lVar5 + 0x80); puVar10 != puVar2; puVar10 = puVar10 + 4) {
          if (!bVar7) {
            std::operator<<(this->o,',');
          }
          unparse(this,(AST *)*puVar10,(bool)((~bVar7 | (this->opts).padArrays) & 1));
          bVar7 = false;
          fill(this,(Fodder *)(puVar10 + 1),false,false);
        }
        if (*(char *)(lVar5 + 0x98) != '\0') {
          std::operator<<(this->o,",");
        }
        pFVar13 = (Fodder *)(lVar5 + 0xa0);
        bVar14 = *(long *)(lVar5 + 0x88) != *(long *)(lVar5 + 0x80);
        bVar7 = (this->opts).padArrays;
LAB_001e6c4d:
        fill(this,pFVar13,bVar14,bVar7);
        poVar6 = this->o;
        pcVar9 = "]";
LAB_001e6c5c:
        std::operator<<(poVar6,pcVar9);
        return;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ArrayComprehension::typeinfo);
      if (lVar5 != 0) {
        std::operator<<(this->o,"[");
        unparse(this,*(AST **)(lVar5 + 0x80),(this->opts).padArrays);
        fill(this,(Fodder *)(lVar5 + 0x88),false,false);
        if (*(char *)(lVar5 + 0xa0) == '\x01') {
          std::operator<<(this->o,",");
        }
        unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                           *)(lVar5 + 0xa8));
        pFVar13 = (Fodder *)(lVar5 + 0xc0);
        bVar7 = (this->opts).padArrays;
        bVar14 = true;
        goto LAB_001e6c4d;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Assert::typeinfo);
      if (lVar5 != 0) {
        std::operator<<(this->o,"assert");
        unparse(this,*(AST **)(lVar5 + 0x80),true);
        if (*(long *)(lVar5 + 0xa0) != 0) {
          fill(this,(Fodder *)(lVar5 + 0x88),true,true);
          std::operator<<(this->o,":");
          unparse(this,*(AST **)(lVar5 + 0xa0),true);
        }
        fill(this,(Fodder *)(lVar5 + 0xa8),false,false);
        std::operator<<(this->o,";");
        puVar10 = (undefined8 *)(lVar5 + 0xc0);
        goto LAB_001e6753;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Binary::typeinfo);
      if (lVar5 != 0) {
        unparse(this,*(AST **)(lVar5 + 0x80),bVar7);
        fill(this,(Fodder *)(lVar5 + 0x88),true,true);
        poVar6 = this->o;
        bop_string_abi_cxx11_(&local_60,(internal *)(ulong)*(uint *)(lVar5 + 0xa0),bop);
        std::operator<<(poVar6,(string *)&local_60);
        std::__cxx11::string::~string((string *)&local_60);
        pAVar4 = *(AST **)(lVar5 + 0xa8);
        goto LAB_001e6cd0;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&BuiltinFunction::typeinfo);
      if (lVar5 != 0) {
        poVar6 = std::operator<<(this->o,"/* builtin ");
        poVar6 = std::operator<<(poVar6,(string *)(lVar5 + 0x80));
        pcVar9 = " */ null";
        goto LAB_001e6c5c;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Conditional::typeinfo);
      if (lVar5 != 0) {
        std::operator<<(this->o,"if");
        unparse(this,*(AST **)(lVar5 + 0x80),true);
        fill(this,(Fodder *)(lVar5 + 0x88),true,true);
        std::operator<<(this->o,"then");
        if (*(long *)(lVar5 + 0xc0) == 0) {
          puVar10 = (undefined8 *)(lVar5 + 0xa0);
        }
        else {
          puVar10 = (undefined8 *)(lVar5 + 0xc0);
          unparse(this,*(AST **)(lVar5 + 0xa0),true);
          fill(this,(Fodder *)(lVar5 + 0xa8),true,true);
          std::operator<<(this->o,"else");
        }
        goto LAB_001e6753;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Dollar::typeinfo);
      if (lVar5 != 0) {
        poVar6 = this->o;
        pcVar9 = "$";
        goto LAB_001e6c5c;
      }
      lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Error::typeinfo);
      if (lVar5 == 0) {
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Function::typeinfo);
        if (lVar5 != 0) {
          std::operator<<(this->o,"function");
          unparseParams(this,(Fodder *)(lVar5 + 0x80),(ArgParams *)(lVar5 + 0x98),
                        *(bool *)(lVar5 + 0xb0),(Fodder *)(lVar5 + 0xb8));
          puVar10 = (undefined8 *)(lVar5 + 0xd0);
          goto LAB_001e6753;
        }
        lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Import::typeinfo);
        if (lVar5 == 0) {
          lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Importstr::typeinfo);
          if (lVar5 == 0) {
            lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Importbin::typeinfo);
            if (lVar5 == 0) {
              lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&InSuper::typeinfo);
              if (lVar5 != 0) {
                unparse(this,*(AST **)(lVar5 + 0x80),true);
                fill(this,(Fodder *)(lVar5 + 0x88),true,true);
                std::operator<<(this->o,"in");
                fill(this,(Fodder *)(lVar5 + 0xa0),true,true);
                poVar6 = this->o;
                pcVar9 = "super";
                goto LAB_001e6c5c;
              }
              lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Index::typeinfo);
              if (lVar5 == 0) {
                local_38 = __dynamic_cast(ast_,&AST::typeinfo,&Local::typeinfo);
                if (local_38 != 0) {
                  std::operator<<(this->o,"local");
                  local_40 = *(Fodder **)(local_38 + 0x88);
                  if (local_40 == *(Fodder **)(local_38 + 0x80)) {
                    __assert_fail("ast->binds.size() > 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                  ,0x1d0,
                                  "void jsonnet::internal::Unparser::unparse(const AST *, bool)");
                  }
                  bVar7 = true;
                  for (ppFVar12 = &(*(Fodder **)(local_38 + 0x80))[5].
                                   super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                   ._M_impl.super__Vector_impl_data._M_finish;
                      (Fodder *)(ppFVar12 + -0x10) != local_40; ppFVar12 = ppFVar12 + 0x16) {
                    if (!bVar7) {
                      std::operator<<(this->o,",");
                    }
                    fill(this,(Fodder *)(ppFVar12 + -0x10),true,true);
                    poVar6 = this->o;
                    encode_utf8(&local_60,(UString *)ppFVar12[-0xd]);
                    std::operator<<(poVar6,(string *)&local_60);
                    std::__cxx11::string::~string((string *)&local_60);
                    if (*(char *)(ppFVar12 + -8) == '\x01') {
                      unparseParams(this,(Fodder *)(ppFVar12 + -7),(ArgParams *)(ppFVar12 + -4),
                                    *(bool *)&((_Vector_impl_data *)(ppFVar12 + -1))->_M_start,
                                    (Fodder *)ppFVar12);
                    }
                    fill(this,(Fodder *)(ppFVar12 + -0xc),true,true);
                    std::operator<<(this->o,"=");
                    unparse(this,(AST *)ppFVar12[-9],true);
                    bVar7 = false;
                    fill(this,(Fodder *)(ppFVar12 + 3),false,false);
                  }
                  std::operator<<(this->o,";");
                  pAVar4 = *(AST **)(local_38 + 0x98);
LAB_001e6cd0:
                  bVar7 = true;
LAB_001e6cd6:
                  unparse(this,pAVar4,bVar7);
                  return;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralBoolean::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar9 = "false";
                  if (*(char *)(lVar5 + 0x80) != '\0') {
                    pcVar9 = "true";
                  }
                  goto LAB_001e6c5c;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNumber::typeinfo);
                if (lVar5 != 0) {
                  std::operator<<(this->o,(string *)(lVar5 + 0x88));
                  return;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralString::typeinfo);
                if (lVar5 != 0) {
                  switch(*(undefined4 *)(lVar5 + 0xa0)) {
                  case 0:
                    std::operator<<(this->o,"\'");
                    poVar6 = this->o;
                    encode_utf8(&local_60,(UString *)(lVar5 + 0x80));
                    std::operator<<(poVar6,(string *)&local_60);
                    std::__cxx11::string::~string((string *)&local_60);
                    goto LAB_001e7185;
                  case 1:
                    std::operator<<(this->o,"\"");
                    poVar6 = this->o;
                    encode_utf8(&local_60,(UString *)(lVar5 + 0x80));
                    std::operator<<(poVar6,(string *)&local_60);
                    std::__cxx11::string::~string((string *)&local_60);
                    goto LAB_001e741c;
                  case 2:
                    std::operator<<(this->o,"|||");
                    if (*(int *)(*(long *)(lVar5 + 0x80) + -4 + *(long *)(lVar5 + 0x88) * 4) != 10)
                    {
                      std::operator<<(this->o,"-");
                    }
                    std::operator<<(this->o,"\n");
                    pcVar11 = *(char32_t **)(lVar5 + 0x80);
                    if (*pcVar11 != L'\n') {
                      std::operator<<(this->o,(string *)(lVar5 + 0xa8));
                      pcVar11 = *(char32_t **)(lVar5 + 0x80);
                    }
                    break;
                  case 3:
                    std::operator<<(this->o,"@\'");
                    pcVar11 = *(char32_t **)(lVar5 + 0x80);
                    goto LAB_001e745a;
                  case 4:
                    std::operator<<(this->o,"@\"");
                    pcVar11 = *(char32_t **)(lVar5 + 0x80);
                    goto LAB_001e7386;
                  case 5:
                    __assert_fail("ast->tokenKind != LiteralString::RAW_DESUGARED",
                                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/formatter.cpp"
                                  ,0x1ed,
                                  "void jsonnet::internal::Unparser::unparse(const AST *, bool)");
                  default:
                    goto switchD_001e7144_default;
                  }
                  goto LAB_001e72f2;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&LiteralNull::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar9 = "null";
                  goto LAB_001e6c5c;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Object::typeinfo);
                if (lVar5 != 0) {
                  std::operator<<(this->o,"{");
                  unparseFields(this,(ObjectFields *)(lVar5 + 0x80),(this->opts).padObjects);
                  if (*(char *)(lVar5 + 0x98) == '\x01') {
                    std::operator<<(this->o,",");
                  }
                  pFVar13 = (Fodder *)(lVar5 + 0xa0);
                  bVar14 = *(long *)(lVar5 + 0x88) != *(long *)(lVar5 + 0x80);
                  bVar7 = (this->opts).padObjects;
LAB_001e7257:
                  fill(this,pFVar13,bVar14,bVar7);
                  poVar6 = this->o;
                  goto LAB_001e725f;
                }
                local_40 = (Fodder *)__dynamic_cast(ast_,&AST::typeinfo,&DesugaredObject::typeinfo);
                if (local_40 != (Fodder *)0x0) {
                  std::operator<<(this->o,"{");
                  ppFVar12 = &local_40[5].
                              super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  pFVar8 = (pointer)ppFVar12;
                  while (pFVar8 = *(pointer *)pFVar8, pFVar8 != (pointer)ppFVar12) {
                    pAVar4 = (AST *)(pFVar8->comment).
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start;
                    std::operator<<(this->o,"assert");
                    unparse(this,pAVar4,true);
                    std::operator<<(this->o,",");
                  }
                  pFVar3 = local_40[6].
                           super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
                  for (pFVar8 = local_40[6].
                                super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                ._M_impl.super__Vector_impl_data._M_finish; poVar6 = this->o,
                      pFVar8 != pFVar3;
                      pFVar8 = (pointer)&(pFVar8->comment).
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish) {
                    std::operator<<(poVar6,"[");
                    unparse(this,*(AST **)&pFVar8->indent,false);
                    std::operator<<(this->o,"]");
                    if ((ulong)pFVar8->kind < 3) {
                      std::operator<<(this->o,*(char **)(&DAT_00285c78 + (ulong)pFVar8->kind * 8));
                    }
                    unparse(this,(AST *)(pFVar8->comment).
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start,true);
                    std::operator<<(this->o,",");
                  }
LAB_001e725f:
                  pcVar9 = "}";
                  goto LAB_001e6c5c;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehension::typeinfo);
                if (lVar5 != 0) {
                  std::operator<<(this->o,"{");
                  unparseFields(this,(ObjectFields *)(lVar5 + 0x80),(this->opts).padObjects);
                  if (*(char *)(lVar5 + 0x98) == '\x01') {
                    std::operator<<(this->o,",");
                  }
                  unparseSpecs(this,(vector<jsonnet::internal::ComprehensionSpec,_std::allocator<jsonnet::internal::ComprehensionSpec>_>
                                     *)(lVar5 + 0xa0));
                  pFVar13 = (Fodder *)(lVar5 + 0xb8);
                  bVar7 = (this->opts).padObjects;
                  bVar14 = true;
                  goto LAB_001e7257;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&ObjectComprehensionSimple::typeinfo);
                if (lVar5 != 0) {
                  std::operator<<(this->o,"{[");
                  unparse(this,*(AST **)(lVar5 + 0x80),false);
                  std::operator<<(this->o,"]:");
                  unparse(this,*(AST **)(lVar5 + 0x88),true);
                  poVar6 = std::operator<<(this->o," for ");
                  encode_utf8(&local_60,*(UString **)(lVar5 + 0x90));
                  poVar6 = std::operator<<(poVar6,(string *)&local_60);
                  std::operator<<(poVar6," in");
                  std::__cxx11::string::~string((string *)&local_60);
                  unparse(this,*(AST **)(lVar5 + 0x98),true);
                  poVar6 = this->o;
                  pcVar9 = "}";
                  goto LAB_001e6b0e;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Parens::typeinfo);
                if (lVar5 != 0) {
                  std::operator<<(this->o,"(");
                  unparse(this,*(AST **)(lVar5 + 0x80),false);
                  fill(this,(Fodder *)(lVar5 + 0x88),false,false);
                  poVar6 = this->o;
                  pcVar9 = ")";
                  goto LAB_001e6c5c;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Self::typeinfo);
                if (lVar5 != 0) {
                  poVar6 = this->o;
                  pcVar9 = "self";
                  goto LAB_001e6c5c;
                }
                lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&SuperIndex::typeinfo);
                if (lVar5 == 0) {
                  auVar15 = __dynamic_cast(ast_,&AST::typeinfo,&Unary::typeinfo,0);
                  lVar5 = auVar15._0_8_;
                  if (lVar5 != 0) {
                    poVar6 = this->o;
                    uop_string_abi_cxx11_
                              (&local_60,(internal *)(ulong)*(uint *)(lVar5 + 0x80),auVar15._8_4_);
                    std::operator<<(poVar6,(string *)&local_60);
                    std::__cxx11::string::~string((string *)&local_60);
                    pAVar4 = *(AST **)(lVar5 + 0x88);
                    bVar7 = false;
                    goto LAB_001e6cd6;
                  }
                  lVar5 = __dynamic_cast(ast_,&AST::typeinfo,&Var::typeinfo,0);
                  if (lVar5 != 0) {
                    poVar6 = this->o;
                    encode_utf8(&local_60,*(UString **)(lVar5 + 0x80));
                    std::operator<<(poVar6,(string *)&local_60);
LAB_001e6e42:
                    std::__cxx11::string::~string((string *)&local_60);
                    return;
                  }
                  goto LAB_001e79a6;
                }
                std::operator<<(this->o,"super");
                fill(this,(Fodder *)(lVar5 + 0x80),false,false);
                if (*(long *)(lVar5 + 0xb8) != 0) {
                  std::operator<<(this->o,".");
                  fill(this,(Fodder *)(lVar5 + 0xa0),false,false);
                  poVar6 = this->o;
                  encode_utf8(&local_60,*(UString **)(lVar5 + 0xb8));
                  std::operator<<(poVar6,(string *)&local_60);
                  goto LAB_001e6e42;
                }
                std::operator<<(this->o,"[");
                unparse(this,*(AST **)(lVar5 + 0x98),false);
                pFVar13 = (Fodder *)(lVar5 + 0xa0);
              }
              else {
                unparse(this,*(AST **)(lVar5 + 0x80),bVar7);
                fill(this,(Fodder *)(lVar5 + 0x88),false,false);
                if (*(long *)(lVar5 + 0x108) != 0) {
                  std::operator<<(this->o,".");
                  fill(this,(Fodder *)(lVar5 + 0xf0),false,false);
                  poVar6 = this->o;
                  encode_utf8(&local_60,*(UString **)(lVar5 + 0x108));
                  std::operator<<(poVar6,(string *)&local_60);
                  goto LAB_001e6e42;
                }
                std::operator<<(this->o,"[");
                pAVar4 = *(AST **)(lVar5 + 0xa8);
                if (*(char *)(lVar5 + 0xa0) == '\x01') {
                  if (pAVar4 != (AST *)0x0) {
                    unparse(this,pAVar4,false);
                  }
                  fill(this,(Fodder *)(lVar5 + 0xb0),false,false);
                  std::operator<<(this->o,":");
                  if (*(AST **)(lVar5 + 200) != (AST *)0x0) {
                    unparse(this,*(AST **)(lVar5 + 200),false);
                  }
                  if ((*(long *)(lVar5 + 0xe8) != 0) ||
                     (*(long *)(lVar5 + 0xd8) != *(long *)(lVar5 + 0xd0))) {
                    fill(this,(Fodder *)(lVar5 + 0xd0),false,false);
                    std::operator<<(this->o,":");
                    pAVar4 = *(AST **)(lVar5 + 0xe8);
                    if (pAVar4 != (AST *)0x0) goto LAB_001e703b;
                  }
                }
                else {
LAB_001e703b:
                  unparse(this,pAVar4,false);
                }
                pFVar13 = (Fodder *)(lVar5 + 0xf0);
              }
              bVar14 = false;
              bVar7 = false;
              goto LAB_001e6c4d;
            }
            poVar6 = this->o;
            pcVar9 = "importbin";
          }
          else {
            poVar6 = this->o;
            pcVar9 = "importstr";
          }
        }
        else {
          poVar6 = this->o;
          pcVar9 = "import";
        }
      }
      else {
        poVar6 = this->o;
        pcVar9 = "error";
      }
      std::operator<<(poVar6,pcVar9);
      puVar10 = (undefined8 *)(lVar5 + 0x80);
    }
    else {
      unparse(this,*(AST **)(lVar5 + 0x80),bVar7);
      puVar10 = (undefined8 *)(lVar5 + 0x88);
    }
LAB_001e6753:
    ast_ = (AST *)*puVar10;
    space_before = true;
  } while( true );
LAB_001e7386:
  cVar1 = *pcVar11;
  if (cVar1 == L'\"') {
    std::operator<<(this->o,"\"\"");
  }
  else {
    if (cVar1 == L'\0') goto LAB_001e741c;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    encode_utf8(cVar1,&local_60);
    std::operator<<(this->o,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pcVar11 = pcVar11 + 1;
  goto LAB_001e7386;
LAB_001e745a:
  cVar1 = *pcVar11;
  if (cVar1 == L'\'') {
    std::operator<<(this->o,"\'\'");
  }
  else {
    if (cVar1 == L'\0') goto LAB_001e7185;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    encode_utf8(cVar1,&local_60);
    std::operator<<(this->o,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
  }
  pcVar11 = pcVar11 + 1;
  goto LAB_001e745a;
LAB_001e72f2:
  cVar1 = *pcVar11;
  if (cVar1 != L'\r') {
    if (cVar1 == L'\0') goto LAB_001e74b1;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    encode_utf8(cVar1,&local_60);
    std::operator<<(this->o,(string *)&local_60);
    if (((*pcVar11 == L'\n') && (pcVar11[1] != L'\0')) && (pcVar11[1] != L'\n')) {
      std::operator<<(this->o,(string *)(lVar5 + 0xa8));
    }
    std::__cxx11::string::~string((string *)&local_60);
  }
  pcVar11 = pcVar11 + 1;
  goto LAB_001e72f2;
LAB_001e741c:
  poVar6 = this->o;
  pcVar9 = "\"";
  goto LAB_001e6b0e;
LAB_001e7185:
  poVar6 = this->o;
  pcVar9 = "\'";
  goto LAB_001e6b0e;
LAB_001e74b1:
  if (*(int *)(*(long *)(lVar5 + 0x80) + -4 + *(long *)(lVar5 + 0x88) * 4) != 10) {
    std::operator<<(this->o,"\n");
  }
  poVar6 = std::operator<<(this->o,(string *)(lVar5 + 200));
  pcVar9 = "|||";
LAB_001e6b0e:
  std::operator<<(poVar6,pcVar9);
switchD_001e7144_default:
  return;
}

Assistant:

void unparse(const AST *ast_, bool space_before)
    {
        bool separate_token = !left_recursive(ast_);

        fill(ast_->openFodder, space_before, separate_token);

        if (auto *ast = dynamic_cast<const Apply *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->fodderL, false, false);
            o << "(";
            bool first = true;
            for (const auto &arg : ast->args) {
                if (!first)
                    o << ',';
                bool space = !first;
                if (arg.id != nullptr) {
                    fill(arg.idFodder, space, true);
                    o << unparse_id(arg.id);
                    space = false;
                    o << "=";
                }
                unparse(arg.expr, space);
                fill(arg.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->fodderR, false, false);
            o << ")";
            if (ast->tailstrict) {
                fill(ast->tailstrictFodder, true, true);
                o << "tailstrict";
            }

        } else if (auto *ast = dynamic_cast<const ApplyBrace *>(ast_)) {
            unparse(ast->left, space_before);
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const Array *>(ast_)) {
            o << "[";
            bool first = true;
            for (const auto &element : ast->elements) {
                if (!first)
                    o << ',';
                unparse(element.expr, !first || opts.padArrays);
                fill(element.commaFodder, false, false);
                first = false;
            }
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->elements.size() > 0, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const ArrayComprehension *>(ast_)) {
            o << "[";
            unparse(ast->body, opts.padArrays);
            fill(ast->commaFodder, false, false);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padArrays);
            o << "]";

        } else if (auto *ast = dynamic_cast<const Assert *>(ast_)) {
            o << "assert";
            unparse(ast->cond, true);
            if (ast->message != nullptr) {
                fill(ast->colonFodder, true, true);
                o << ":";
                unparse(ast->message, true);
            }
            fill(ast->semicolonFodder, false, false);
            o << ";";
            unparse(ast->rest, true);

        } else if (auto *ast = dynamic_cast<const Binary *>(ast_)) {
            unparse(ast->left, space_before);
            fill(ast->opFodder, true, true);
            o << bop_string(ast->op);
            // The - 1 is for left associativity.
            unparse(ast->right, true);

        } else if (auto *ast = dynamic_cast<const BuiltinFunction *>(ast_)) {
            o << "/* builtin " << ast->name << " */ null";

        } else if (auto *ast = dynamic_cast<const Conditional *>(ast_)) {
            o << "if";
            unparse(ast->cond, true);
            fill(ast->thenFodder, true, true);
            o << "then";
            if (ast->branchFalse != nullptr) {
                unparse(ast->branchTrue, true);
                fill(ast->elseFodder, true, true);
                o << "else";
                unparse(ast->branchFalse, true);
            } else {
                unparse(ast->branchTrue, true);
            }

        } else if (dynamic_cast<const Dollar *>(ast_)) {
            o << "$";

        } else if (auto *ast = dynamic_cast<const Error *>(ast_)) {
            o << "error";
            unparse(ast->expr, true);

        } else if (auto *ast = dynamic_cast<const Function *>(ast_)) {
            o << "function";
            unparseParams(
                ast->parenLeftFodder, ast->params, ast->trailingComma, ast->parenRightFodder);
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const Import *>(ast_)) {
            o << "import";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importstr *>(ast_)) {
            o << "importstr";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const Importbin *>(ast_)) {
            o << "importbin";
            unparse(ast->file, true);

        } else if (auto *ast = dynamic_cast<const InSuper *>(ast_)) {
            unparse(ast->element, true);
            fill(ast->inFodder, true, true);
            o << "in";
            fill(ast->superFodder, true, true);
            o << "super";

        } else if (auto *ast = dynamic_cast<const Index *>(ast_)) {
            unparse(ast->target, space_before);
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                if (ast->isSlice) {
                    if (ast->index != nullptr) {
                        unparse(ast->index, false);
                    }
                    fill(ast->endColonFodder, false, false);
                    o << ":";
                    if (ast->end != nullptr) {
                        unparse(ast->end, false);
                    }
                    if (ast->step != nullptr || ast->stepColonFodder.size() > 0) {
                        fill(ast->stepColonFodder, false, false);
                        o << ":";
                        if (ast->step != nullptr) {
                            unparse(ast->step, false);
                        }
                    }
                } else {
                    unparse(ast->index, false);
                }
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Local *>(ast_)) {
            o << "local";
            assert(ast->binds.size() > 0);
            bool first = true;
            for (const auto &bind : ast->binds) {
                if (!first)
                    o << ",";
                first = false;
                fill(bind.varFodder, true, true);
                o << unparse_id(bind.var);
                if (bind.functionSugar) {
                    unparseParams(bind.parenLeftFodder,
                                  bind.params,
                                  bind.trailingComma,
                                  bind.parenRightFodder);
                }
                fill(bind.opFodder, true, true);
                o << "=";
                unparse(bind.body, true);
                fill(bind.closeFodder, false, false);
            }
            o << ";";
            unparse(ast->body, true);

        } else if (auto *ast = dynamic_cast<const LiteralBoolean *>(ast_)) {
            o << (ast->value ? "true" : "false");

        } else if (auto *ast = dynamic_cast<const LiteralNumber *>(ast_)) {
            o << ast->originalString;

        } else if (auto *ast = dynamic_cast<const LiteralString *>(ast_)) {
            assert(ast->tokenKind != LiteralString::RAW_DESUGARED);
            if (ast->tokenKind == LiteralString::DOUBLE) {
                o << "\"";
                o << encode_utf8(ast->value);
                o << "\"";
            } else if (ast->tokenKind == LiteralString::SINGLE) {
                o << "'";
                o << encode_utf8(ast->value);
                o << "'";
            } else if (ast->tokenKind == LiteralString::BLOCK) {
                o << "|||";
                if (ast->value.back() != U'\n') {
                    o << "-";
                }
                o << "\n";
                if (ast->value.c_str()[0] != U'\n')
                    o << ast->blockIndent;
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    // Formatter always outputs in unix mode.
                    if (*cp == '\r') continue;
                    std::string utf8;
                    encode_utf8(*cp, utf8);
                    o << utf8;
                    if (*cp == U'\n' && *(cp + 1) != U'\n' && *(cp + 1) != U'\0') {
                        o << ast->blockIndent;
                    }
                }
                if (ast->value.back() != U'\n') {
                    o << "\n";
                }
                o << ast->blockTermIndent << "|||";
            } else if (ast->tokenKind == LiteralString::VERBATIM_DOUBLE) {
                o << "@\"";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'"') {
                        o << "\"\"";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "\"";
            } else if (ast->tokenKind == LiteralString::VERBATIM_SINGLE) {
                o << "@'";
                for (const char32_t *cp = ast->value.c_str(); *cp != U'\0'; ++cp) {
                    if (*cp == U'\'') {
                        o << "''";
                    } else {
                        std::string utf8;
                        encode_utf8(*cp, utf8);
                        o << utf8;
                    }
                }
                o << "'";
            }

        } else if (dynamic_cast<const LiteralNull *>(ast_)) {
            o << "null";

        } else if (auto *ast = dynamic_cast<const Object *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            fill(ast->closeFodder, ast->fields.size() > 0, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const DesugaredObject *>(ast_)) {
            o << "{";
            for (AST *assert : ast->asserts) {
                o << "assert";
                unparse(assert, true);
                o << ",";
            }
            for (auto &field : ast->fields) {
                o << "[";
                unparse(field.name, false);
                o << "]";
                switch (field.hide) {
                    case ObjectField::INHERIT: o << ":"; break;
                    case ObjectField::HIDDEN: o << "::"; break;
                    case ObjectField::VISIBLE: o << ":::"; break;
                }
                unparse(field.body, true);
                o << ",";
            }
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehension *>(ast_)) {
            o << "{";
            unparseFields(ast->fields, opts.padObjects);
            if (ast->trailingComma)
                o << ",";
            unparseSpecs(ast->specs);
            fill(ast->closeFodder, true, opts.padObjects);
            o << "}";

        } else if (auto *ast = dynamic_cast<const ObjectComprehensionSimple *>(ast_)) {
            o << "{[";
            unparse(ast->field, false);
            o << "]:";
            unparse(ast->value, true);
            o << " for " << unparse_id(ast->id) << " in";
            unparse(ast->array, true);
            o << "}";

        } else if (auto *ast = dynamic_cast<const Parens *>(ast_)) {
            o << "(";
            unparse(ast->expr, false);
            fill(ast->closeFodder, false, false);
            o << ")";

        } else if (dynamic_cast<const Self *>(ast_)) {
            o << "self";

        } else if (auto *ast = dynamic_cast<const SuperIndex *>(ast_)) {
            o << "super";
            fill(ast->dotFodder, false, false);
            if (ast->id != nullptr) {
                o << ".";
                fill(ast->idFodder, false, false);
                o << unparse_id(ast->id);
            } else {
                o << "[";
                unparse(ast->index, false);
                fill(ast->idFodder, false, false);
                o << "]";
            }

        } else if (auto *ast = dynamic_cast<const Unary *>(ast_)) {
            o << uop_string(ast->op);
            unparse(ast->expr, false);

        } else if (auto *ast = dynamic_cast<const Var *>(ast_)) {
            o << encode_utf8(ast->id->name);

        } else {
            std::cerr << "INTERNAL ERROR: Unknown AST: " << ast_ << std::endl;
            std::abort();
        }
    }